

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_database.cpp
# Opt level: O2

void __thiscall
OpenCorruptStore_HeaderID_Test::~OpenCorruptStore_HeaderID_Test
          (OpenCorruptStore_HeaderID_Test *this)

{
  anon_unknown.dwarf_59778::OpenCorruptStore::~OpenCorruptStore(&this->super_OpenCorruptStore);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST_F (OpenCorruptStore, HeaderID) {
    // This test is only valid if CRC checking is enabled.
    if (pstore::database::crc_checks_enabled ()) {
        auto h = this->get_header ();
        pstore::uuid & id = h->a.id;
        pstore::uuid::container_type old = id.array ();
        old[0] = !old[0];

        // Rebuild the UUID in place.
        h->a.id.~uuid ();
        new (&id) pstore::uuid (old);

        // An inconsistency in the sync_name field is caught by the CRC value no longer matching.
        // If CRC checks are disabled, then it's caught by the sync-name alphabet check.
        this->check_database_open (pstore::error_code::header_corrupt);
    }
}